

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O0

Vec_Bit_t * Pla_ManPrimesTable(int nVars)

{
  int b;
  int iVar1;
  Vec_Bit_t *p;
  Vec_Bit_t *vMap;
  int nBits;
  int n;
  int i;
  int nVars_local;
  
  b = 1 << ((byte)nVars & 0x1f);
  iVar1 = Abc_MaxInt(0x40,b);
  p = Vec_BitStartFull(iVar1);
  for (nBits = b; nBits < 0x40; nBits = nBits + 1) {
    Vec_BitWriteEntry(p,nBits,0);
  }
  Vec_BitShrink(p,b);
  Vec_BitWriteEntry(p,0,0);
  Vec_BitWriteEntry(p,1,0);
  for (vMap._4_4_ = 2; vMap._4_4_ < b; vMap._4_4_ = vMap._4_4_ + 1) {
    iVar1 = Vec_BitEntry(p,vMap._4_4_);
    if (iVar1 != 0) {
      for (nBits = vMap._4_4_ << 1; nBits < b; nBits = vMap._4_4_ + nBits) {
        Vec_BitWriteEntry(p,nBits,0);
      }
    }
  }
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Generates prime detector for the given bit-widths.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Bit_t * Pla_ManPrimesTable( int nVars )
{
    int i, n, nBits = 1 << nVars;
    Vec_Bit_t * vMap = Vec_BitStartFull( Abc_MaxInt(64, nBits) );
    for ( i = nBits; i < 64; i++ )
        Vec_BitWriteEntry( vMap, i, 0 );
    Vec_BitShrink( vMap, nBits );
    Vec_BitWriteEntry( vMap, 0, 0 );
    Vec_BitWriteEntry( vMap, 1, 0 );
    for ( n = 2; n < nBits; n++ )
        if ( Vec_BitEntry(vMap, n) )
            for ( i = 2*n; i < nBits; i += n )
                Vec_BitWriteEntry( vMap, i, 0 );
    return vMap;
}